

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O0

int __thiscall
cppcms::sessions::session_file_storage::remove(session_file_storage *this,char *__filename)

{
  int iVar1;
  int extraout_EAX;
  char *__name;
  locked_file file;
  bool in_stack_000000df;
  string *in_stack_000000e0;
  session_file_storage *in_stack_000000e8;
  locked_file *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff38;
  string local_b0 [32];
  locked_file *in_stack_ffffffffffffff70;
  string local_80 [32];
  locked_file local_60;
  char *local_10;
  session_file_storage *local_8;
  
  local_10 = __filename;
  local_8 = this;
  std::__cxx11::string::string(local_80,(string *)__filename);
  locked_file::locked_file(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000df);
  std::__cxx11::string::~string(local_80);
  iVar1 = locked_file::fd(&local_60);
  if (-1 < iVar1) {
    locked_file::name_abi_cxx11_((locked_file *)CONCAT44(iVar1,in_stack_ffffffffffffff38));
    __name = (char *)std::__cxx11::string::c_str();
    unlink(__name);
    std::__cxx11::string::~string(local_b0);
  }
  locked_file::~locked_file(in_stack_ffffffffffffff70);
  return extraout_EAX;
}

Assistant:

void session_file_storage::remove(std::string const &sid)
{
	locked_file file(this,sid,false);
	if(file.fd() >= 0)
		::unlink(file.name().c_str());
}